

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::make_string<char_const(&)[20],CylHead&,char_const(&)[8]>
          (string *__return_storage_ptr__,util *this,char (*args) [20],CylHead *args_1,
          char (*args_2) [8])

{
  ostringstream local_1a0 [8];
  ostringstream ss;
  char (*args_local_2) [8];
  CylHead *args_local_1;
  char (*args_local) [20];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(char *)this);
  ::operator<<((ostream *)local_1a0,(CylHead *)args);
  std::operator<<((ostream *)local_1a0,(char *)args_1);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}